

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequenceDictionary.cpp
# Opt level: O1

bool __thiscall
BamTools::SamSequenceDictionary::Contains(SamSequenceDictionary *this,SamSequence *sequence)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->m_lookupData)._M_t,&sequence->Name);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->m_lookupData)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool SamSequenceDictionary::Contains(const SamSequence& sequence) const {
    return Contains(sequence.Name);
}